

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tx_search.c
# Opt level: O0

void recon_intra(AV1_COMP *cpi,MACROBLOCK *x,int plane,int block,int blk_row,int blk_col,
                BLOCK_SIZE plane_bsize,TX_SIZE tx_size,TXB_CTX *txb_ctx,int skip_trellis,
                TX_TYPE best_tx_type,int do_quant,int *rate_cost,uint16_t best_eob)

{
  int blk_row_00;
  MACROBLOCK *x_00;
  int in_ECX;
  int in_EDX;
  long in_RSI;
  int in_R8D;
  int in_R9D;
  byte in_stack_00000008;
  byte in_stack_00000010;
  QUANT_PARAM quant_param_intra;
  short in_stack_00000040;
  TxfmParam txfm_param_intra;
  int is_inter;
  MB_MODE_INFO *mbmi;
  MACROBLOCKD *xd;
  AV1_COMMON *cm;
  QUANT_PARAM *in_stack_ffffffffffffff68;
  MB_MODE_INFO *in_stack_ffffffffffffff70;
  int in_stack_ffffffffffffff78;
  int in_stack_ffffffffffffff7c;
  undefined6 in_stack_ffffffffffffff80;
  TX_TYPE in_stack_ffffffffffffff86;
  TX_SIZE in_stack_ffffffffffffff87;
  MACROBLOCK *in_stack_ffffffffffffff88;
  AV1_COMMON *in_stack_ffffffffffffff90;
  undefined4 in_stack_ffffffffffffff98;
  int in_stack_ffffffffffffff9c;
  undefined1 local_54 [10];
  TX_TYPE in_stack_ffffffffffffffb6;
  TX_SIZE in_stack_ffffffffffffffb7;
  int in_stack_ffffffffffffffb8;
  int in_stack_ffffffffffffffbc;
  int in_stack_ffffffffffffffc0;
  AV1_COMP *cpi_00;
  
  x_00 = (MACROBLOCK *)(in_RSI + 0x1a0);
  cpi_00 = (AV1_COMP *)**(undefined8 **)(in_RSI + 0x2058);
  blk_row_00 = is_inter_block(in_stack_ffffffffffffff70);
  if (((blk_row_00 == 0) && (in_stack_00000040 != 0)) &&
     ((in_R8D + tx_size_high_unit[in_stack_00000010] <
       (int)(uint)"\x01\x02\x01\x02\x04\x02\x04\b\x04\b\x10\b\x10 \x10 \x04\x01\b\x02\x10\x04"
                  [in_stack_00000008] ||
      (in_R9D + tx_size_wide_unit[in_stack_00000010] <
       (int)(uint)"\x01\x01\x02\x02\x02\x04\x04\x04\b\b\b\x10\x10\x10  \x01\x04\x02\b\x04\x10"
                  [in_stack_00000008])))) {
    if (quant_param_intra.use_quant_b_adapt != 0) {
      av1_setup_xform(in_stack_ffffffffffffff90,in_stack_ffffffffffffff88,in_stack_ffffffffffffff87,
                      in_stack_ffffffffffffff86,
                      (TxfmParam *)CONCAT44(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78));
      av1_setup_quant((TX_SIZE)((ulong)in_stack_ffffffffffffff70 >> 0x38),
                      (int)in_stack_ffffffffffffff70,(int)((ulong)in_stack_ffffffffffffff68 >> 0x20)
                      ,(int)in_stack_ffffffffffffff68,(QUANT_PARAM *)0x336155);
      av1_setup_qmatrix((CommonQuantParams *)
                        CONCAT17(in_stack_ffffffffffffff87,
                                 CONCAT16(in_stack_ffffffffffffff86,in_stack_ffffffffffffff80)),
                        (MACROBLOCKD *)CONCAT44(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78)
                        ,(int)((ulong)in_stack_ffffffffffffff70 >> 0x20),
                        (TX_SIZE)((ulong)in_stack_ffffffffffffff70 >> 0x18),
                        (TX_TYPE)((ulong)in_stack_ffffffffffffff70 >> 0x10),
                        in_stack_ffffffffffffff68);
      av1_xform_quant((MACROBLOCK *)
                      CONCAT17(in_stack_ffffffffffffff87,
                               CONCAT16(in_stack_ffffffffffffff86,in_stack_ffffffffffffff80)),
                      in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78,
                      (int)((ulong)&stack0xffffffffffffff80 >> 0x20),(int)&stack0xffffffffffffff80,
                      (BLOCK_SIZE)((ulong)local_54 >> 0x38),(TxfmParam *)in_stack_ffffffffffffff90,
                      (QUANT_PARAM *)CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98));
      if (in_stack_ffffffffffffff9c != 0) {
        av1_optimize_b(cpi_00,(MACROBLOCK *)CONCAT44(blk_row_00,in_stack_ffffffffffffffc0),
                       in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8,in_stack_ffffffffffffffb7
                       ,in_stack_ffffffffffffffb6,(TXB_CTX *)CONCAT44(in_R8D,in_R9D),
                       (int *)CONCAT44(in_EDX,in_ECX));
      }
    }
    inverse_transform_block_facade
              (x_00,(int)((ulong)cpi_00 >> 0x20),(int)cpi_00,blk_row_00,in_stack_ffffffffffffffc0,
               in_stack_ffffffffffffffbc,in_R9D);
    if (((in_EDX == 0) && (*(short *)(*(long *)(in_RSI + 0x20) + (long)in_ECX * 2) == 0)) &&
       ((char)quant_param_intra.iqmatrix != '\0')) {
      update_txk_array((MACROBLOCKD *)x_00,in_R8D,in_R9D,in_stack_00000010,'\0');
    }
  }
  return;
}

Assistant:

static inline void recon_intra(const AV1_COMP *cpi, MACROBLOCK *x, int plane,
                               int block, int blk_row, int blk_col,
                               BLOCK_SIZE plane_bsize, TX_SIZE tx_size,
                               const TXB_CTX *const txb_ctx, int skip_trellis,
                               TX_TYPE best_tx_type, int do_quant,
                               int *rate_cost, uint16_t best_eob) {
  const AV1_COMMON *cm = &cpi->common;
  MACROBLOCKD *xd = &x->e_mbd;
  MB_MODE_INFO *mbmi = xd->mi[0];
  const int is_inter = is_inter_block(mbmi);
  if (!is_inter && best_eob &&
      (blk_row + tx_size_high_unit[tx_size] < mi_size_high[plane_bsize] ||
       blk_col + tx_size_wide_unit[tx_size] < mi_size_wide[plane_bsize])) {
    // if the quantized coefficients are stored in the dqcoeff buffer, we don't
    // need to do transform and quantization again.
    if (do_quant) {
      TxfmParam txfm_param_intra;
      QUANT_PARAM quant_param_intra;
      av1_setup_xform(cm, x, tx_size, best_tx_type, &txfm_param_intra);
      av1_setup_quant(tx_size, !skip_trellis,
                      skip_trellis
                          ? (USE_B_QUANT_NO_TRELLIS ? AV1_XFORM_QUANT_B
                                                    : AV1_XFORM_QUANT_FP)
                          : AV1_XFORM_QUANT_FP,
                      cpi->oxcf.q_cfg.quant_b_adapt, &quant_param_intra);
      av1_setup_qmatrix(&cm->quant_params, xd, plane, tx_size, best_tx_type,
                        &quant_param_intra);
      av1_xform_quant(x, plane, block, blk_row, blk_col, plane_bsize,
                      &txfm_param_intra, &quant_param_intra);
      if (quant_param_intra.use_optimize_b) {
        av1_optimize_b(cpi, x, plane, block, tx_size, best_tx_type, txb_ctx,
                       rate_cost);
      }
    }

    inverse_transform_block_facade(x, plane, block, blk_row, blk_col,
                                   x->plane[plane].eobs[block],
                                   cm->features.reduced_tx_set_used);

    // This may happen because of hash collision. The eob stored in the hash
    // table is non-zero, but the real eob is zero. We need to make sure tx_type
    // is DCT_DCT in this case.
    if (plane == 0 && x->plane[plane].eobs[block] == 0 &&
        best_tx_type != DCT_DCT) {
      update_txk_array(xd, blk_row, blk_col, tx_size, DCT_DCT);
    }
  }
}